

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taskq.c
# Opt level: O1

void nni_taskq_fini(nni_taskq *tq)

{
  long lVar1;
  long lVar2;
  
  if (tq != (nni_taskq *)0x0) {
    if (tq->tq_run == true) {
      nni_mtx_lock(&tq->tq_mtx);
      tq->tq_run = false;
      nni_cv_wake(&tq->tq_sched_cv);
      nni_mtx_unlock(&tq->tq_mtx);
    }
    if (0 < tq->tq_nthreads) {
      lVar1 = 8;
      lVar2 = 0;
      do {
        nni_thr_fini((nni_thr *)((long)&tq->tq_threads->tqt_tq + lVar1));
        lVar2 = lVar2 + 1;
        lVar1 = lVar1 + 0xa0;
      } while (lVar2 < tq->tq_nthreads);
    }
    nni_cv_fini(&tq->tq_wait_cv);
    nni_cv_fini(&tq->tq_sched_cv);
    nni_mtx_fini(&tq->tq_mtx);
    nni_free(tq->tq_threads,(long)tq->tq_nthreads * 0xa0);
    nni_free(tq,0xc0);
    return;
  }
  return;
}

Assistant:

void
nni_taskq_fini(nni_taskq *tq)
{
	if (tq == NULL) {
		return;
	}
	if (tq->tq_run) {
		nni_mtx_lock(&tq->tq_mtx);
		tq->tq_run = false;
		nni_cv_wake(&tq->tq_sched_cv);
		nni_mtx_unlock(&tq->tq_mtx);
	}
	for (int i = 0; i < tq->tq_nthreads; i++) {
		nni_thr_fini(&tq->tq_threads[i].tqt_thread);
	}
	nni_cv_fini(&tq->tq_wait_cv);
	nni_cv_fini(&tq->tq_sched_cv);
	nni_mtx_fini(&tq->tq_mtx);
	NNI_FREE_STRUCTS(tq->tq_threads, tq->tq_nthreads);
	NNI_FREE_STRUCT(tq);
}